

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTailIdx.cpp
# Opt level: O2

void __thiscall liblogger::LogTailIdx::Log(LogTailIdx *this,LogType Type,string *str)

{
  LogManagerScopedLock lock;
  LogManagerScopedLock local_39;
  undefined1 local_38 [40];
  
  LogManager::Lock();
  local_39.m_locked = true;
  std::
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long_&,_true>
            ((pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38,&this->m_current,str);
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<unsigned_long,std::__cxx11::string>>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
              *)&this->m_data,
             (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  this->m_current = this->m_current + 1;
  if (this->m_length <= (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                        *)&this->m_data,
                       (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  LogManagerScopedLock::~LogManagerScopedLock(&local_39);
  return;
}

Assistant:

void LogTailIdx::Log(const LogType Type, const std::string &str) {
	LogManagerScopedLock lock = LogManagerScopedLock();
	m_data.insert(std::make_pair(m_current, str));
	m_current++;
	if (m_data.size() >= m_length)
	{
		m_data.erase(m_data.begin());
	}
}